

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::Desc(Desc *this,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *base)

{
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *this_00;
  Desc *pDVar1;
  Desc *pDVar2;
  
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::DataArray(&this->rowstat,0,0,1.2);
  this_00 = &this->colstat;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::DataArray(this_00,0,0,1.2);
  reSize(this,(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum,
         (base->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum);
  pDVar2 = (Desc *)this_00;
  pDVar1 = this;
  if (base->theRep != ROW) {
    pDVar2 = this;
    pDVar1 = (Desc *)this_00;
  }
  this->stat = &pDVar1->rowstat;
  this->costat = &pDVar2->rowstat;
  return;
}

Assistant:

SPxBasisBase<R>::Desc::Desc(const SPxSolverBase<R>& base)
{
   reSize(base.nRows(), base.nCols());

   if(base.rep() == SPxSolverBase<R>::ROW)
   {
      stat   = &rowstat;
      costat = &colstat;
   }
   else
   {
      assert(base.rep() == SPxSolverBase<R>::COLUMN);

      stat   = &colstat;
      costat = &rowstat;
   }

   assert(Desc::isConsistent());
}